

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void icetMatrixMultiplyScale(IceTDouble *mat_out,IceTDouble x,IceTDouble y,IceTDouble z)

{
  IceTDouble transform [16];
  IceTDouble local_88 [6];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  IceTDouble local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  local_88[3] = 0.0;
  local_88[4] = 0.0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_30 = 0;
  uStack_28 = 0;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0x3ff0000000000000;
  local_88[0] = x;
  local_88[5] = y;
  local_38 = z;
  icetMatrixPostMultiply(mat_out,local_88);
  return;
}

Assistant:

void icetMatrixMultiplyScale(IceTDouble *mat_out,
                             IceTDouble x,
                             IceTDouble y,
                             IceTDouble z)
{
    IceTDouble transform[16];
    icetMatrixScale(x, y, z, transform);
    icetMatrixPostMultiply(mat_out, (const IceTDouble *)transform);
}